

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O3

uc_err uc_reg_write(uc_engine *uc,int regid,void *value)

{
  uc_err uVar1;
  int setpc;
  size_t size;
  int local_2c;
  size_t local_28;
  
  if ((uc->init_done != false) || (uVar1 = uc_init_engine(uc), uVar1 == UC_ERR_OK)) {
    local_2c = 0;
    local_28 = 0xffffffffffffffff;
    uVar1 = (*uc->reg_write)(uc->cpu->env_ptr,uc->mode,regid,value,&local_28,&local_2c);
    if ((uVar1 == UC_ERR_OK) &&
       (((local_2c != 0 && (uc->quit_request = true, uc->emulation_done == false)) &&
        (uc->cpu != (CPUState *)0x0)))) {
      cpu_exit(uc->cpu);
    }
  }
  return uVar1;
}

Assistant:

UNICORN_EXPORT
uc_err uc_reg_write(uc_engine *uc, int regid, const void *value)
{
    UC_INIT(uc);
    int setpc = 0;
    size_t size = (size_t)-1;
    uc_err err =
        uc->reg_write(uc->cpu->env_ptr, uc->mode, regid, value, &size, &setpc);
    if (err) {
        return err;
    }
    if (setpc) {
        // force to quit execution and flush TB
        uc->quit_request = true;
        break_translation_loop(uc);
    }

    return UC_ERR_OK;
}